

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O0

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<2>>>>,mp::QuadAndLinTerms,2>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>
                 *cc,
          PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
          *prepro)

{
  bool bVar1;
  Var r;
  Type TVar2;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  QuadAndLinTerms *in_RDX;
  long in_RSI;
  QuadAndLinTerms *in_RDI;
  double dVar3;
  double dVar4;
  PreprocessInfoStd bnt;
  double rhs;
  Arguments arg1;
  Arguments *algc;
  QuadAndLinTerms *in_stack_fffffffffffff7d8;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_> *in_stack_fffffffffffff7e0;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_> *in_stack_fffffffffffff7e8;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_> *in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7fc;
  undefined1 fSort;
  AlgConRhs<_2> rr;
  BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffff820;
  PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
  *in_stack_fffffffffffff828;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>
  *in_stack_fffffffffffff830;
  ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffff838;
  AlgConRhs<_2> local_7c0 [47];
  Arguments *in_stack_fffffffffffff9b8;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>_>
  *in_stack_fffffffffffff9c0;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_> local_200;
  Arguments *local_20;
  QuadAndLinTerms *local_18;
  long local_10;
  
  fSort = (undefined1)((uint)in_stack_fffffffffffff7fc >> 0x18);
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = CheckEmptySubCon<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<2>>,mp::PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<2>>>>>
                    (in_stack_fffffffffffff838,in_stack_fffffffffffff830,in_stack_fffffffffffff828);
  if (!bVar1) {
    PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
    ::narrow_result_bounds
              ((PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
                *)in_stack_fffffffffffff7f0,(double)in_stack_fffffffffffff7e8,
               (double)in_stack_fffffffffffff7e0);
    PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
    ::set_result_type((PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
                       *)local_18,INTEGER);
    local_20 = CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
               ::GetArguments((CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
                               *)(local_10 + 0x28));
    bVar1 = IsNormalized<mp::QuadAndLinTerms,2>
                      ((ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                        *)in_stack_fffffffffffff7e0,
                       (ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>
                        *)in_stack_fffffffffffff7d8);
    if (bVar1) {
      dVar3 = AlgConRhs<2>::rhs(&local_20->super_AlgConRhs<2>);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>::GetBody(local_20);
      BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
      ::ComputeBoundsAndType(in_stack_fffffffffffff820,in_RDI);
      bVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::IfPreproIneqRHS((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                 *)0x281c55);
      if ((bVar1) &&
         (TVar2 = PreprocessInfo<int>::get_result_type
                            ((PreprocessInfo<int> *)&stack0xfffffffffffff820), TVar2 == INTEGER)) {
        in_stack_fffffffffffff7e8 =
             (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_> *)floor(dVar3);
        dVar4 = ceil(dVar3);
        if (((double)in_stack_fffffffffffff7e8 != dVar4) ||
           (NAN((double)in_stack_fffffffffffff7e8) || NAN(dVar4))) {
          in_stack_fffffffffffff7e0 =
               (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_> *)
               &local_20->super_AlgConRhs<2>;
          dVar4 = floor(dVar3);
          AlgConRhs<2>::set_rhs((AlgConRhs<2> *)in_stack_fffffffffffff7e0,dVar4);
        }
      }
      bVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::IfPreproIneqResBounds
                        ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)0x281cd1);
      if (bVar1) {
        dVar4 = PreprocessInfo<int>::lb((PreprocessInfo<int> *)&stack0xfffffffffffff820);
        if (dVar4 <= dVar3) {
          dVar4 = PreprocessInfo<int>::ub((PreprocessInfo<int> *)&stack0xfffffffffffff820);
          if (dVar4 <= dVar3) {
            PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
            ::narrow_result_bounds
                      ((PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
                        *)in_stack_fffffffffffff7f0,(double)in_stack_fffffffffffff7e8,
                       (double)in_stack_fffffffffffff7e0);
          }
        }
        else {
          PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
          ::narrow_result_bounds
                    ((PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
                      *)in_stack_fffffffffffff7f0,(double)in_stack_fffffffffffff7e8,
                     (double)in_stack_fffffffffffff7e0);
        }
      }
    }
    else {
      rr.rhs_ = (double)&local_200;
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>::AlgebraicConstraint
                (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>::negate
                ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_> *)
                 in_stack_fffffffffffff7e0);
      this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 *)AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>::GetBody(&local_200);
      QuadAndLinTerms::QuadAndLinTerms
                ((QuadAndLinTerms *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
      dVar3 = AlgConRhs<2>::rhs(&local_200.super_AlgConRhs<2>);
      AlgConRhs<-2>::AlgConRhs(local_7c0,dVar3);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-2>_>::AlgebraicConstraint
                ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_> *)this_00,local_18,rr
                 ,(bool)fSort);
      ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-2>_>_>::
      ConditionalConstraint(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      r = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AssignResultVar2Args<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_2>>>>
                    (this_00,(ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>_>
                              *)local_18);
      PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
      ::set_result_var((PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
                        *)local_18,r);
      ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-2>_>_>::
      ~ConditionalConstraint
                ((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_>_>
                  *)0x281b73);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-2>_>::~AlgebraicConstraint
                (in_stack_fffffffffffff7e0);
      QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_fffffffffffff7e0);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>::~AlgebraicConstraint
                ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_> *)
                 in_stack_fffffffffffff7e0);
    }
  }
  return;
}

Assistant:

void PreprocessConstraint(
      ConditionalConstraint<
        AlgebraicConstraint< Body, AlgConRhs<kind> > >& cc,
      PreprocessInfo& prepro) {
    if (CheckEmptySubCon(cc, prepro))
      return;
    prepro.narrow_result_bounds(0.0, 1.0);
    prepro.set_result_type( var::INTEGER );
    assert(kind);
    auto& algc = cc.GetArguments();
    if (!IsNormalized(cc)) {
      auto arg1 = algc; // Add the normalized one instead
      arg1.negate();    // Negate the terms and sense
      prepro.set_result_var(
            MPD( AssignResultVar2Args(
                   ConditionalConstraint<
                     AlgebraicConstraint< Body, AlgConRhs<
                   -kind> > > { {
                   std::move(arg1.GetBody()), arg1.rhs()
                 } } ) ));
      return;
    }
    // See if we need to round the constant term
    auto rhs = algc.rhs();
    auto bnt = MPD(
          ComputeBoundsAndType(algc.GetBody()) );
    if (MPCD( IfPreproIneqRHS() )
        && var::INTEGER == bnt.get_result_type()
        && std::floor(rhs) != std::ceil(rhs)) {  // rhs not int
      if (1==kind)  // algc is >=
        algc.set_rhs( std::ceil(rhs) );
      else if (-1==kind)
        algc.set_rhs( std::floor(rhs) );
      else if (2==kind)  // algc is >
        algc.set_rhs( std::floor(rhs) ); // > floor(rhs)
      else {
        assert(-2==kind);
        algc.set_rhs( std::ceil(rhs) );
      }
    }
    // Decidable cases
    if (MPCD( IfPreproIneqResBounds() )) {
      if ((1==kind && bnt.lb()>=rhs)
          || (-1==kind && bnt.ub()<=rhs)
          || (2==kind && bnt.lb()>rhs)
          || (-2==kind && bnt.ub()<rhs)) {
        prepro.narrow_result_bounds(1.0, 1.0);   // TRUE
      } else {
        if ((1==kind && bnt.ub()<rhs)
            || (-1==kind && bnt.lb()>rhs)
            || (2==kind && bnt.ub()<=rhs)
            || (-2==kind && bnt.lb()>=rhs)) {
          prepro.narrow_result_bounds(0.0, 0.0);   // FALSE
        }
      }
    }
  }